

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_append.c
# Opt level: O0

int mpt_message_append(mpt_array *arr,mpt_message *msg)

{
  size_t *psVar1;
  void *pvVar2;
  size_t local_58;
  uint8_t *base;
  size_t clen;
  size_t olen;
  size_t used;
  iovec *cont;
  mpt_buffer *buf;
  mpt_message *msg_local;
  mpt_array *arr_local;
  
  if (arr->_buf == (mpt_buffer *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = arr->_buf->_used;
  }
  if ((msg->used == 0) ||
     (pvVar2 = mpt_array_append(arr,msg->used,msg->base), pvVar2 != (void *)0x0)) {
    used = (size_t)msg->cont;
    base = (uint8_t *)msg->clen;
    do {
      base = base + -1;
      if (base == (uint8_t *)0x0) {
        return 0;
      }
      pvVar2 = *(void **)used;
      psVar1 = (size_t *)(used + 8);
      used = used + 0x10;
    } while ((*psVar1 == 0) ||
            (pvVar2 = mpt_array_append(arr,*psVar1,pvVar2), pvVar2 != (void *)0x0));
    if (arr->_buf != (mpt_buffer *)0x0) {
      arr->_buf->_used = local_58;
    }
  }
  else if (arr->_buf != (mpt_buffer *)0x0) {
    arr->_buf->_used = local_58;
  }
  return -0x11;
}

Assistant:

extern int mpt_message_append(MPT_STRUCT(array) *arr, const MPT_STRUCT(message) *msg)
{
	MPT_STRUCT(buffer) *buf;
	struct iovec *cont;
	size_t used ,olen, clen;
	
	olen = (buf = arr->_buf) ? buf->_used : 0;
	
	/* process first message part */
	if ((used = msg->used)
	    && !mpt_array_append(arr, used, msg->base)) {
		/* reset array state */
		if ((buf = arr->_buf)) {
			buf->_used = olen;
		}
		return MPT_ERROR(MissingBuffer);
	}
	/* trailing message parts */
	cont = msg->cont;
	clen = msg->clen;
	while (--clen) {
		const uint8_t *base;
		base = cont->iov_base;
		used = cont->iov_len;
		++cont;
		/* skip empty segments */
		if (!used || mpt_array_append(arr, used, base)) {
			continue;
		}
		/* reset array state */
		if ((buf = arr->_buf)) {
			buf->_used = olen;
		}
		return MPT_ERROR(MissingBuffer);
	}
	return 0;
}